

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O3

object * __thiscall
msgpack::v1::adaptor::convert<std::tuple<int>,_void>::operator()
          (convert<std::tuple<int>,_void> *this,object *o,tuple<int> *v)

{
  object *poVar1;
  int iVar2;
  undefined8 *puVar3;
  object local_28;
  
  if ((o->super_object).type == ARRAY) {
    if ((o->super_object).via.array.size != 0) {
      poVar1 = (o->super_object).via.array.ptr;
      local_28.via.array.ptr = (poVar1->super_object).via.array.ptr;
      local_28.type = (poVar1->super_object).type;
      local_28._4_4_ = *(undefined4 *)&(poVar1->super_object).field_0x4;
      local_28.via.u64 = (poVar1->super_object).via.u64;
      iVar2 = type::detail::convert_integer_sign<int,_true>::convert((object *)&local_28);
      (v->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>._M_head_impl = iVar2;
    }
    return o;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__bad_cast_0015a7e0;
  __cxa_throw(puVar3,&type_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

msgpack::object const& operator()(
        msgpack::object const& o,
        std::tuple<Args...>& v) const {
        if(o.type != msgpack::type::ARRAY) { throw msgpack::type_error(); }
        StdTupleConverter<decltype(v), sizeof...(Args)>::convert(o, v);
        return o;
    }